

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O2

TAttributes * __thiscall
glslang::TParseContext::makeAttributes(TParseContext *this,TString *identifier,TIntermNode *node)

{
  list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_> *this_00;
  TIntermAggregate *pTVar1;
  TParseContext *this_01;
  TAttributeArgs args;
  value_type local_30;
  
  this_00 = &NewPoolObject<glslang::TList<glslang::TAttributeArgs>>
                       ((TList<glslang::TAttributeArgs> *)0x0)->
             super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>;
  this_01 = (TParseContext *)(this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar1 = TIntermediate::makeAggregate((TIntermediate *)this_01,node);
  local_30.name = attributeFromName(this_01,identifier);
  local_30.args = pTVar1;
  std::__cxx11::list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::
  push_back(this_00,&local_30);
  return (TAttributes *)this_00;
}

Assistant:

TAttributes* TParseContext::makeAttributes(const TString& identifier, TIntermNode* node) const
{
    TAttributes *attributes = nullptr;
    attributes = NewPoolObject(attributes);

    // for now, node is always a simple single expression, but other code expects
    // a list, so make it so
    TIntermAggregate* agg = intermediate.makeAggregate(node);
    TAttributeArgs args = { attributeFromName(identifier), agg };
    attributes->push_back(args);
    return attributes;
}